

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_shift_new_globals(REF_NODE ref_node)

{
  int iVar1;
  REF_MPI ref_mpi;
  REF_GLOB *pRVar2;
  long lVar3;
  uint uVar4;
  void *array;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  REF_INT new_nodes;
  int local_2c;
  
  ref_mpi = ref_node->ref_mpi;
  if ((long)ref_mpi->n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x2d9,
           "ref_node_shift_new_globals","malloc everyones_new_nodes of REF_INT negative");
    uVar4 = 1;
  }
  else {
    array = malloc((long)ref_mpi->n << 2);
    if (array == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x2d9,
             "ref_node_shift_new_globals","malloc everyones_new_nodes of REF_INT NULL");
      uVar4 = 2;
    }
    else {
      local_2c = (int)ref_node->new_n_global - (int)ref_node->old_n_global;
      uVar4 = ref_mpi_allgather(ref_mpi,&local_2c,array,1);
      if (uVar4 == 0) {
        if ((long)ref_mpi->id < 1) {
          lVar8 = 0;
        }
        else {
          lVar5 = 0;
          lVar8 = 0;
          do {
            lVar8 = lVar8 + *(int *)((long)array + lVar5 * 4);
            lVar5 = lVar5 + 1;
          } while (ref_mpi->id != lVar5);
        }
        if ((long)ref_mpi->n < 1) {
          lVar5 = 0;
        }
        else {
          lVar6 = 0;
          lVar5 = 0;
          do {
            lVar5 = lVar5 + *(int *)((long)array + lVar6 * 4);
            lVar6 = lVar6 + 1;
          } while (ref_mpi->n != lVar6);
        }
        free(array);
        if (lVar8 != 0) {
          iVar1 = ref_node->max;
          if (0 < (long)iVar1) {
            pRVar2 = ref_node->global;
            lVar6 = 0;
            do {
              lVar7 = pRVar2[lVar6];
              if ((-1 < lVar7) && (ref_node->old_n_global <= lVar7)) {
                pRVar2[lVar6] = lVar7 + lVar8;
              }
              lVar6 = lVar6 + 1;
            } while (iVar1 != lVar6);
          }
          if (0 < (long)ref_node->n) {
            pRVar2 = ref_node->sorted_global;
            lVar6 = (long)ref_node->n + 1;
            do {
              lVar7 = pRVar2[lVar6 + -2];
              if (lVar7 < ref_node->old_n_global) break;
              pRVar2[lVar6 + -2] = lVar7 + lVar8;
              lVar6 = lVar6 + -1;
            } while (1 < lVar6);
          }
          iVar1 = ref_node->n_unused;
          if (0 < (long)iVar1) {
            lVar6 = ref_node->old_n_global;
            pRVar2 = ref_node->unused_global;
            lVar7 = 0;
            do {
              lVar3 = pRVar2[lVar7];
              if (lVar6 <= lVar3) {
                pRVar2[lVar7] = lVar3 + lVar8;
              }
              lVar7 = lVar7 + 1;
            } while (iVar1 != lVar7);
          }
        }
        lVar5 = lVar5 + ref_node->old_n_global;
        ref_node->old_n_global = lVar5;
        ref_node->new_n_global = lVar5;
        uVar4 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x2de,"ref_node_shift_new_globals",(ulong)uVar4,"allgather");
      }
    }
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_node_shift_new_globals(REF_NODE ref_node) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT new_nodes;
  REF_INT *everyones_new_nodes;
  REF_GLOB offset, total_new_nodes;
  REF_INT proc, node;

  ref_malloc(everyones_new_nodes, ref_mpi_n(ref_mpi), REF_INT);

  new_nodes = (REF_INT)(ref_node->new_n_global - ref_node->old_n_global);

  RSS(ref_mpi_allgather(ref_mpi, &new_nodes, everyones_new_nodes, REF_INT_TYPE),
      "allgather");

  offset = 0;
  for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++) {
    offset += everyones_new_nodes[proc];
  }

  total_new_nodes = 0;
  each_ref_mpi_part(ref_mpi, proc) {
    total_new_nodes += everyones_new_nodes[proc];
  }

  ref_free(everyones_new_nodes);

  if (0 != offset) {
    each_ref_node_valid_node(ref_node, node) {
      if (ref_node_global(ref_node, node) >= ref_node->old_n_global) {
        (ref_node->global[node]) += offset;
      }
    }
    for (node = ref_node_n(ref_node) - 1;
         node >= 0 && ref_node->sorted_global[node] >= ref_node->old_n_global;
         node--)
      ref_node->sorted_global[node] += offset;

    RSS(ref_node_shift_unused(ref_node, ref_node->old_n_global, offset),
        "shift");
  }

  RSS(ref_node_initialize_n_global(ref_node,
                                   total_new_nodes + ref_node->old_n_global),
      "re-init");

  return REF_SUCCESS;
}